

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayStack.hpp
# Opt level: O0

bool __thiscall
cplus::utils::ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push
          (ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *this,TreeNode **value)

{
  uint uVar1;
  TreeNode **ppTVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar5;
  TreeNode **ppTVar6;
  TreeNode **lastSave;
  TreeNode **value_local;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *this_local;
  
  if (this->endPoint == this->blockSize) {
    ppTVar2 = this->last;
    if (this->lastState != (TreeNode **)0x0) {
      if (this->lastState != (TreeNode **)0x0) {
        operator_delete(this->lastState);
      }
      this->lastState = (TreeNode **)0x0;
    }
    auVar3 = ZEXT416(this->blockSize) * ZEXT816(8);
    uVar5 = auVar3._0_8_;
    if (auVar3._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppTVar6 = (TreeNode **)operator_new__(uVar5);
    this->last = ppTVar6;
    bVar4 = Stack<cplus::utils::Set<cplus::lang::String>::TreeNode_**>::push
                      (&this->blockArrayStack,&this->last);
    if (!bVar4) {
      if (this->last != (TreeNode **)0x0) {
        operator_delete(this->last);
      }
      this->last = ppTVar2;
      return false;
    }
    this->endPoint = 0;
  }
  uVar1 = this->endPoint;
  this->endPoint = uVar1 + 1;
  memory::copy<cplus::utils::Set<cplus::lang::String>::TreeNode*>(value,this->last + uVar1);
  return true;
}

Assistant:

bool push(const T &value) {
//				std::cout << "ArrayStack: bool push(const K &key): endpoint:" << endPoint << std::endl;
				//检查是否已到数据块边界
				if (endPoint == blockSize) {
					//保存last状态
					auto lastSave = last;
					//释放内存
					if (lastState != nullptr) {
						delete lastState;
						lastState = nullptr;
					}
					//分配内存
					last = new T[blockSize];
					//压入数据块栈
					if (!blockArrayStack.push(last)) {
						//如果失败
						//释放内存
						delete last;
						//还原last状态
						last = lastSave;
						//返回false表示失败
						return false;
					} else {
						//如果成功
						//更新endPoint指针状态
						endPoint = 0;
					}
				}
				//压数据入栈
				::cplus::memory::copy(value, last[endPoint++]);
				//返回true表示成功
				return true;
			}